

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O3

optional<int32_t> __thiscall Command::Arg::find_constant(Arg *this,string_view *value)

{
  value_type *pvVar1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *this_00;
  const_iterator cVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  value_type *pvVar3;
  
  pvVar3 = (value_type *)value->__size;
  pvVar1 = value[1].__data;
  while( true ) {
    if (pvVar3 == pvVar1) {
      this->type = Param;
      *(undefined1 *)&this->entity_type = 0;
      return (optional<int32_t>)(OptionalBase<int>)this;
    }
    this_00 = *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                **)pvVar3;
    cVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,iless,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                      (this_00,in_RDX);
    if (cVar2._M_node != (_Base_ptr)(this_00 + 8)) break;
    pvVar3 = pvVar3 + 0x10;
  }
  *(_Rb_tree_color *)&this->entity_type = cVar2._M_node[2]._M_color;
  this->type = Label;
  return (optional<int32_t>)(OptionalBase<int>)this;
}

Assistant:

::optional<int32_t> find_constant(const string_view& value) const
        {
            for(auto& e : enums)
            {
                if(auto opt = e->find(value))
                    return opt;
            }
            return nullopt;
        }